

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O1

void and_or_test(void)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  bitset_container_t *bitset_02;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t x;
  bool bVar13;
  
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  bitset_02 = bitset_container_create();
  iVar3 = bitset_container_compute_cardinality(bitset);
  _assert_true((ulong)(iVar3 == 0),"bitset_container_compute_cardinality(B1) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x6d);
  iVar3 = bitset_container_compute_cardinality(bitset_00);
  _assert_true((ulong)(iVar3 == 0),"bitset_container_compute_cardinality(B2) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x6e);
  iVar3 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar3 == 0),"bitset_container_compute_cardinality(BI) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x6f);
  iVar3 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar3 == 0),"bitset_container_compute_cardinality(BO) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x70);
  _assert_true((unsigned_long)bitset,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x72);
  _assert_true((unsigned_long)bitset_00,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x73);
  _assert_true((unsigned_long)bitset_01,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x74);
  _assert_true((unsigned_long)bitset_02,"BO",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x75);
  puVar1 = bitset->words;
  puVar2 = bitset_01->words;
  uVar7 = 0xfffffffffffffffd;
  do {
    uVar7 = uVar7 + 3;
    uVar10 = uVar7 >> 6;
    uVar12 = puVar1[uVar10];
    uVar11 = uVar12 | 1L << (uVar7 & 0x3f);
    bitset->cardinality = bitset->cardinality + (int)((uVar12 ^ uVar11) >> ((byte)uVar7 & 0x3f));
    puVar1[uVar10] = uVar11;
    uVar12 = puVar2[uVar10];
    uVar11 = uVar12 | 1L << (uVar7 & 0x3f);
    bitset_01->cardinality =
         bitset_01->cardinality + (int)((uVar12 ^ uVar11) >> ((byte)uVar7 & 0x3f));
    puVar2[uVar10] = uVar11;
  } while (uVar7 < 0xea5d);
  uVar7 = 0xfffffffffffffffd;
  do {
    uVar7 = uVar7 + 3;
    _assert_true((ulong)((bitset->words[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0),
                 "bitset_container_get(B1, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x82);
    _assert_true((ulong)((bitset_01->words[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0),
                 "bitset_container_get(BI, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x83);
  } while (uVar7 < 0xea5d);
  iVar3 = bitset_container_compute_cardinality(bitset);
  iVar8 = 20000;
  _assert_true((ulong)(iVar3 == 20000),"bitset_container_compute_cardinality(B1) == b1_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x86);
  iVar3 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar3 == 20000),"bitset_container_compute_cardinality(BI) == bi_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x87);
  puVar1 = bitset_01->words;
  puVar2 = bitset_00->words;
  uVar7 = 0xffffffffffffffc2;
  do {
    uVar7 = uVar7 + 0x3e;
    uVar11 = uVar7 >> 6;
    bVar6 = (byte)uVar7 & 0x3e;
    iVar8 = (iVar8 + 1) - (uint)((puVar1[uVar11] >> bVar6 & 1) != 0);
    uVar12 = puVar2[uVar11];
    uVar10 = uVar12 | 1L << bVar6;
    bitset_00->cardinality = bitset_00->cardinality + (int)((uVar12 ^ uVar10) >> bVar6);
    puVar2[uVar11] = uVar10;
    uVar12 = puVar1[uVar11] | 1L << bVar6;
    bitset_01->cardinality = bitset_01->cardinality + (int)((puVar1[uVar11] ^ uVar12) >> bVar6);
    puVar1[uVar11] = uVar12;
  } while (uVar7 < 0xea22);
  iVar3 = bitset_container_compute_cardinality(bitset_00);
  _assert_true((ulong)(iVar3 == 0x3c8),"bitset_container_compute_cardinality(B2) == b2_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x93);
  iVar3 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar3 == iVar8),"bitset_container_compute_cardinality(BI) == bi_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x94);
  puVar1 = bitset_02->words;
  iVar3 = bitset_02->cardinality;
  uVar7 = 0xffffffffffffff46;
  do {
    uVar7 = uVar7 + 0xba;
    uVar12 = puVar1[uVar7 >> 6];
    bVar6 = (byte)uVar7 & 0x3e;
    uVar10 = uVar12 | 1L << bVar6;
    iVar3 = iVar3 + (int)((uVar12 ^ uVar10) >> bVar6);
    puVar1[uVar7 >> 6] = uVar10;
  } while (uVar7 < 0xe9a6);
  bitset_02->cardinality = iVar3;
  iVar3 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar3 == 0x143),"bitset_container_compute_cardinality(BO) == bo_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x9b);
  iVar3 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar3 == iVar8),"bitset_container_compute_cardinality(BI) == bi_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x9c);
  iVar3 = bitset_container_compute_cardinality(bitset_01);
  iVar4 = bitset_container_compute_cardinality(bitset_02);
  iVar5 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar5 == iVar3),"bitset_container_compute_cardinality(BI) == card_union",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x9f);
  _assert_true((ulong)(iVar8 == iVar3),"bi_count == card_union",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa0);
  iVar8 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar8 == 0x143),"bitset_container_compute_cardinality(BO) == bo_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa1);
  iVar8 = bitset_container_compute_cardinality(bitset_02);
  iVar5 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar8 == iVar5),
               "bitset_container_compute_cardinality(BO) == bitset_container_compute_cardinality(BO)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa3);
  _assert_true((ulong)(iVar4 == 0x143),"card_inter == bo_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa4);
  bitset_container_printf(bitset);
  bitset_container_printf(bitset_00);
  bitset_container_printf(bitset_01);
  bitset_container_andnot_nocard(bitset,bitset_00,bitset_01);
  bitset_container_printf(bitset);
  bitset_container_printf(bitset_00);
  bitset_container_printf(bitset_01);
  uVar7 = 0;
  iVar8 = 0;
  do {
    uVar12 = uVar7 >> 6;
    uVar9 = (uint)uVar7 & 0x3f;
    bVar13 = (bitset_01->words[uVar12] >> uVar9 & 1) != 0;
    _assert_true((ulong)(bVar13 !=
                        ((bitset_00->words[uVar12] >> uVar9 & 1) != 0 ||
                        (bitset->words[uVar12] >> uVar9 & 1) == 0)),"ini == (in1 & !in2)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0xb3);
    iVar8 = iVar8 + (uint)bVar13;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 60000);
  iVar5 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar5 == iVar8),"bitset_container_compute_cardinality(BI) == interc",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xb6);
  iVar8 = bitset_container_compute_cardinality(bitset_01);
  _assert_int_not_equal
            ((long)iVar8,(long)iVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xb7);
  iVar8 = bitset_container_and(bitset,bitset_00,bitset_01);
  _assert_int_not_equal
            ((long)iVar8,(long)iVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xb8);
  bitset_container_or_nocard(bitset,bitset_00,bitset_02);
  iVar3 = bitset_container_compute_cardinality(bitset_02);
  _assert_int_not_equal
            ((long)iVar3,(long)iVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xba);
  iVar3 = bitset_container_or(bitset,bitset_00,bitset_02);
  _assert_int_not_equal
            ((long)iVar3,(long)iVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xbb);
  bitset_container_free(bitset);
  bitset_container_free(bitset_00);
  bitset_container_free(bitset_01);
  bitset_container_free(bitset_02);
  return;
}

Assistant:

DEFINE_TEST(and_or_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* BO = bitset_container_create();
    assert_true(bitset_container_compute_cardinality(B1) == 0);
    assert_true(bitset_container_compute_cardinality(B2) == 0);
    assert_true(bitset_container_compute_cardinality(BI) == 0);
    assert_true(bitset_container_compute_cardinality(BO) == 0);

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(BO);

    size_t max_value = 60000;

    int b1_count = 0;
    int bi_count = 0;
    for (size_t x = 0; x < max_value; x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
        b1_count++;
        bi_count++;
    }
    for (size_t x = 0; x < max_value; x += 3) {
        assert_true(bitset_container_get(B1, x));
        assert_true(bitset_container_get(BI, x));
    }

    assert_true(bitset_container_compute_cardinality(B1) == b1_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);

    int b2_count = 0;
    // important: 62 is not divisible by 3
    for (size_t x = 0; x < max_value; x += 62) {
        bi_count += !bitset_container_get(BI, x);

        bitset_container_set(B2, x);
        bitset_container_set(BI, x);
        b2_count++;
    }

    assert_true(bitset_container_compute_cardinality(B2) == b2_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);
    int bo_count = 0;
    for (size_t x = 0; x < max_value; x += 62 * 3) {
        bitset_container_set(BO, x);
        bo_count++;
    }

    assert_true(bitset_container_compute_cardinality(BO) == bo_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);
    const int card_union = bitset_container_compute_cardinality(BI);
    const int card_inter = bitset_container_compute_cardinality(BO);
    assert_true(bitset_container_compute_cardinality(BI) == card_union);
    assert_true(bi_count == card_union);
    assert_true(bitset_container_compute_cardinality(BO) == bo_count);
    assert_true(bitset_container_compute_cardinality(BO) ==
                bitset_container_compute_cardinality(BO));
    assert_true(card_inter == bo_count);
    bitset_container_printf(B1);  // does it crash?
    bitset_container_printf(B2);  // does it crash?
    bitset_container_printf(BI);  // does it crash?

    bitset_container_andnot_nocard(B1, B2, BI);

    bitset_container_printf(B1);  // does it crash?
    bitset_container_printf(B2);  // does it crash?
    bitset_container_printf(BI);  // does it crash?
    int interc = 0;
    for (size_t x = 0; x < max_value; x++) {
        bool in1 = bitset_container_get(B1, x);
        bool in2 = bitset_container_get(B2, x);
        bool ini = bitset_container_get(BI, x);
        assert_true(ini == (in1 & !in2));
        interc += ini;
    }
    assert_true(bitset_container_compute_cardinality(BI) == interc);
    assert_int_not_equal(bitset_container_compute_cardinality(BI), card_union);
    assert_int_not_equal(bitset_container_and(B1, B2, BI), card_union);
    bitset_container_or_nocard(B1, B2, BO);
    assert_int_not_equal(bitset_container_compute_cardinality(BO), card_inter);
    assert_int_not_equal(bitset_container_or(B1, B2, BO), card_inter);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(BO);
}